

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<unsigned_int>::reallocate
          (QPodArrayOps<unsigned_int> *this,qsizetype alloc,AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  
  pVar1 = QArrayData::reallocateUnaligned
                    (&((this->super_QArrayDataPointer<unsigned_int>).d)->super_QArrayData,
                     (this->super_QArrayDataPointer<unsigned_int>).ptr,4,alloc,option);
  if (pVar1.second != (void *)0x0) {
    (this->super_QArrayDataPointer<unsigned_int>).d = (Data *)pVar1.first;
    (this->super_QArrayDataPointer<unsigned_int>).ptr = (uint *)pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }